

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddLibraryCommand.cxx
# Opt level: O1

bool __thiscall
cmAddLibraryCommand::InitialPass
          (cmAddLibraryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  string *name;
  cmCommand *this_00;
  pointer name_00;
  bool bVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  undefined8 uVar8;
  long lVar9;
  cmState *this_01;
  cmGlobalGenerator *pcVar10;
  long *plVar11;
  ostream *poVar12;
  cmTarget *pcVar13;
  size_type *psVar14;
  _Alloc_hider _Var15;
  TargetType targetType;
  pointer name_01;
  string libType;
  ostringstream e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srclists;
  string local_230;
  string local_210;
  uint local_1f0;
  uint local_1ec;
  cmCommand *local_1e8;
  uint local_1dc;
  uint local_1d8;
  uint local_1d4;
  undefined1 local_1d0 [112];
  ios_base local_160 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  pointer local_38;
  
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_1d0._0_8_ = local_1d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d0,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1d0);
    goto LAB_0022292f;
  }
  pcVar2 = (this->super_cmCommand).Makefile;
  local_1d0._0_8_ = local_1d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"BUILD_SHARED_LIBS","");
  pcVar7 = cmMakefile::GetDefinition(pcVar2,(string *)local_1d0);
  bVar4 = cmSystemTools::IsOff(pcVar7);
  local_1e8 = &this->super_cmCommand;
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,CONCAT71(local_1d0._17_7_,local_1d0[0x10]) + 1);
  }
  targetType = SHARED_LIBRARY - bVar4;
  local_38 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  name_01 = local_38 + 1;
  local_1d8 = 0;
  local_1f0 = 0;
  local_1d4 = 0;
  local_1ec = 0;
  local_1dc = 0;
  do {
    if (name_01 ==
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) goto LAB_00222866;
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    pcVar3 = (name_01->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_210,pcVar3,pcVar3 + name_01->_M_string_length);
    uVar8 = std::__cxx11::string::compare((char *)&local_210);
    if ((int)uVar8 == 0) {
      if (targetType == INTERFACE_LIBRARY) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d0,"INTERFACE library specified with conflicting STATIC type.",
                   0x39);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(local_1e8,&local_230);
        goto LAB_002226f1;
      }
      targetType = STATIC_LIBRARY;
LAB_00222643:
      name_01 = name_01 + 1;
      iVar6 = 0;
      local_1f0 = (uint)CONCAT71((int7)((ulong)uVar8 >> 8),1);
    }
    else {
      uVar8 = std::__cxx11::string::compare((char *)&local_210);
      if ((int)uVar8 == 0) {
        if (targetType != INTERFACE_LIBRARY) {
          targetType = SHARED_LIBRARY;
          goto LAB_00222643;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d0,"INTERFACE library specified with conflicting SHARED type.",
                   0x39);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(local_1e8,&local_230);
LAB_002226f1:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
        std::ios_base::~ios_base(local_160);
        targetType = INTERFACE_LIBRARY;
      }
      else {
        uVar8 = std::__cxx11::string::compare((char *)&local_210);
        if ((int)uVar8 == 0) {
          if (targetType != INTERFACE_LIBRARY) {
            targetType = MODULE_LIBRARY;
            goto LAB_00222643;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1d0,
                     "INTERFACE library specified with conflicting MODULE type.",0x39);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(local_1e8,&local_230);
          goto LAB_002226f1;
        }
        uVar8 = std::__cxx11::string::compare((char *)&local_210);
        if ((int)uVar8 == 0) {
          if (targetType != INTERFACE_LIBRARY) {
            targetType = OBJECT_LIBRARY;
            goto LAB_00222643;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1d0,
                     "INTERFACE library specified with conflicting OBJECT type.",0x39);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(local_1e8,&local_230);
          goto LAB_002226f1;
        }
        uVar8 = std::__cxx11::string::compare((char *)&local_210);
        if ((int)uVar8 == 0) {
          if (targetType != INTERFACE_LIBRARY) {
            targetType = UNKNOWN_LIBRARY;
            goto LAB_00222643;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1d0,
                     "INTERFACE library specified with conflicting UNKNOWN type.",0x3a);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(local_1e8,&local_230);
          goto LAB_002226f1;
        }
        uVar8 = std::__cxx11::string::compare((char *)&local_210);
        if ((int)uVar8 == 0) {
          if (targetType != INTERFACE_LIBRARY) {
            name_01 = name_01 + 1;
            iVar6 = 0;
            local_1d4 = (uint)CONCAT71((int7)((ulong)uVar8 >> 8),1);
            goto LAB_00222734;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1d0,"INTERFACE library specified with conflicting ALIAS type."
                     ,0x38);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(local_1e8,&local_230);
          goto LAB_002226f1;
        }
        uVar8 = std::__cxx11::string::compare((char *)&local_210);
        if ((int)uVar8 != 0) {
          uVar8 = std::__cxx11::string::compare((char *)name_01);
          if ((int)uVar8 == 0) {
            if (targetType == INTERFACE_LIBRARY) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d0,
                         "INTERFACE library may not be used with EXCLUDE_FROM_ALL.",0x38);
              std::__cxx11::stringbuf::str();
              cmCommand::SetError(local_1e8,&local_230);
              goto LAB_002226f1;
            }
            local_1dc = (uint)CONCAT71((int7)((ulong)uVar8 >> 8),1);
          }
          else {
            uVar8 = std::__cxx11::string::compare((char *)name_01);
            if ((int)uVar8 != 0) {
              if (((local_1ec & 1) == 0) ||
                 (uVar8 = std::__cxx11::string::compare((char *)name_01), (int)uVar8 != 0)) {
                iVar6 = 3;
                if ((targetType == INTERFACE_LIBRARY) &&
                   (iVar5 = std::__cxx11::string::compare((char *)name_01), iVar5 == 0)) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1d0,
                             "GLOBAL option may only be used with IMPORTED libraries.",0x37);
                  std::__cxx11::stringbuf::str();
                  cmCommand::SetError(local_1e8,&local_230);
                  goto LAB_002226f1;
                }
              }
              else {
                name_01 = name_01 + 1;
                iVar6 = 0;
                local_1d8 = (uint)CONCAT71((int7)((ulong)uVar8 >> 8),1);
              }
              goto LAB_00222734;
            }
            local_1ec = (uint)CONCAT71((int7)((ulong)uVar8 >> 8),1);
          }
          name_01 = name_01 + 1;
          iVar6 = 0;
          goto LAB_00222734;
        }
        if ((local_1f0 & 1) == 0) {
          if ((local_1d4 & 1) == 0) {
            if ((local_1dc & 1) == 0) {
              targetType = INTERFACE_LIBRARY;
              goto LAB_00222643;
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1d0,
                       "INTERFACE library may not be used with EXCLUDE_FROM_ALL.",0x38);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(local_1e8,&local_230);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1d0,
                       "INTERFACE library specified with conflicting ALIAS type.",0x38);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(local_1e8,&local_230);
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1d0,
                     "INTERFACE library specified with conflicting/multiple types.",0x3c);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(local_1e8,&local_230);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
        std::ios_base::~ios_base(local_160);
      }
      iVar6 = 1;
    }
LAB_00222734:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
  } while (iVar6 == 0);
  if (iVar6 != 3) {
    return false;
  }
LAB_00222866:
  name_00 = local_38;
  this_00 = local_1e8;
  if (targetType == INTERFACE_LIBRARY) {
    if (name_01 ==
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      if (((local_1d8 & 1) == 0) || ((local_1ec & 1) != 0)) goto LAB_0022296e;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d0,"INTERFACE library specified as GLOBAL, but not as IMPORTED.",
                 0x3b);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(this_00,&local_210);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d0,"INTERFACE library requires no source arguments.",0x2f);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(this_00,&local_210);
    }
LAB_002228c5:
    _Var15._M_p = local_210._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
LAB_002228d9:
      operator_delete(_Var15._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
LAB_002228e1:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
    std::ios_base::~ios_base(local_160);
  }
  else {
LAB_0022296e:
    bVar4 = cmGeneratorExpression::IsValidTargetName(local_38);
    if (bVar4) {
      bVar4 = cmGlobalGenerator::IsReservedTarget(name_00);
      bVar4 = !bVar4;
    }
    else {
      bVar4 = false;
    }
    if (((bVar4) && ((local_1ec & 1) == 0)) && ((local_1d4 & 1) == 0)) {
      lVar9 = std::__cxx11::string::find((char)name_00,0x3a);
      bVar4 = lVar9 == -1;
    }
    if ((!bVar4) && (bVar4 = cmMakefile::CheckCMP0037(this_00->Makefile,name_00,targetType), !bVar4)
       ) {
      return false;
    }
    if ((local_1d4 & 1) == 0) {
      if (((local_1ec & 1) == 0) || ((local_1dc & 1) == 0)) {
        if ((targetType & ~STATIC_LIBRARY) == SHARED_LIBRARY) {
          this_01 = cmMakefile::GetState(this_00->Makefile);
          local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_210,"TARGET_SUPPORTS_SHARED_LIBS","");
          bVar4 = cmState::GetGlobalPropertyAsBool(this_01,&local_210);
          name = local_38;
          bVar4 = !bVar4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar4 = false;
          name = local_38;
        }
        if (bVar4) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1d0,"ADD_LIBRARY called with ",0x18);
          pcVar7 = "MODULE";
          if (targetType == SHARED_LIBRARY) {
            pcVar7 = "SHARED";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,pcVar7,6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1d0,
                     " option but the target platform does not support dynamic linking. Building a STATIC library instead. This may lead to problems."
                     ,0x7f);
          pcVar2 = this_00->Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
          std::ios_base::~ios_base(local_160);
          targetType = STATIC_LIBRARY;
        }
        if ((local_1ec & 1) == 0) {
          if (targetType == UNKNOWN_LIBRARY) {
            pcVar2 = this_00->Makefile;
            local_1d0._0_8_ = local_1d0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1d0,
                       "The UNKNOWN library type may be used only for IMPORTED libraries.","");
            cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_1d0);
            if ((undefined1 *)local_1d0._0_8_ == local_1d0 + 0x10) {
              return true;
            }
            operator_delete((void *)local_1d0._0_8_,CONCAT71(local_1d0._17_7_,local_1d0[0x10]) + 1);
            return true;
          }
          local_1d0._0_8_ = local_1d0 + 0x10;
          local_1d0._8_8_ = 0;
          local_1d0[0x10] = '\0';
          bVar4 = cmMakefile::EnforceUniqueName(this_00->Makefile,name,(string *)local_1d0,false);
          if (bVar4) {
            if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
              operator_delete((void *)local_1d0._0_8_,CONCAT71(local_1d0._17_7_,local_1d0[0x10]) + 1
                             );
            }
          }
          else {
            cmCommand::SetError(this_00,(string *)local_1d0);
            if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
              operator_delete((void *)local_1d0._0_8_,CONCAT71(local_1d0._17_7_,local_1d0[0x10]) + 1
                             );
            }
            if (!bVar4) {
              return false;
            }
          }
          local_58._M_dataplus._M_p = (pointer)0x0;
          local_58._M_string_length = 0;
          local_58.field_2._M_allocated_capacity = 0;
          if (targetType == INTERFACE_LIBRARY) {
            bVar4 = cmGeneratorExpression::IsValidTargetName(name);
            if ((!bVar4) ||
               (lVar9 = std::__cxx11::string::find((char *)name,0x49b2a0,0), lVar9 != -1)) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d0,"Invalid name for INTERFACE library target: ",0x2b);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d0,(name->_M_dataplus)._M_p,name->_M_string_length);
              std::__cxx11::stringbuf::str();
              cmCommand::SetError(this_00,&local_230);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_230._M_dataplus._M_p != &local_230.field_2) {
                operator_delete(local_230._M_dataplus._M_p,
                                local_230.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
              std::ios_base::~ios_base(local_160);
              bVar4 = false;
              goto LAB_00222f44;
            }
            targetType = INTERFACE_LIBRARY;
          }
          else {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_58,0,name_01,
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
          }
          bVar4 = true;
          cmMakefile::AddLibrary
                    (this_00->Makefile,name,targetType,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_58,(bool)((byte)local_1dc & 1));
LAB_00222f44:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_58);
          return bVar4;
        }
        if ((local_1f0 & 1) == 0) {
          local_1d0._0_8_ = local_1d0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1d0,"called with IMPORTED argument but no library type.","");
          cmCommand::SetError(this_00,(string *)local_1d0);
          goto LAB_0022292f;
        }
        paVar1 = &local_230.field_2;
        if (targetType == INTERFACE_LIBRARY) {
          bVar4 = cmGeneratorExpression::IsValidTargetName(name);
          if (bVar4) goto LAB_00223156;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1d0,"Invalid name for IMPORTED INTERFACE library target: ",
                     0x34);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1d0,(name->_M_dataplus)._M_p,name->_M_string_length);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(this_00,&local_230);
        }
        else {
          if (targetType == OBJECT_LIBRARY) {
            local_1d0._0_8_ = local_1d0 + 0x10;
            local_1d0._8_8_ = 0;
            local_1d0[0x10] = '\0';
            pcVar10 = cmMakefile::GetGlobalGenerator(this_00->Makefile);
            iVar6 = (*pcVar10->_vptr_cmGlobalGenerator[0x25])(pcVar10,local_1d0);
            if ((char)iVar6 == '\0') {
              pcVar2 = this_00->Makefile;
              std::operator+(&local_58,
                             "The OBJECT library type may not be used for IMPORTED libraries",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1d0);
              plVar11 = (long *)std::__cxx11::string::append((char *)&local_58);
              psVar14 = (size_type *)(plVar11 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar14) {
                local_230.field_2._M_allocated_capacity = *psVar14;
                local_230.field_2._8_8_ = plVar11[3];
                local_230._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_230.field_2._M_allocated_capacity = *psVar14;
                local_230._M_dataplus._M_p = (pointer)*plVar11;
              }
              local_230._M_string_length = plVar11[1];
              *plVar11 = (long)psVar14;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_230);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_230._M_dataplus._M_p != paVar1) {
                operator_delete(local_230._M_dataplus._M_p,
                                local_230.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p != &local_58.field_2) {
                operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1
                               );
              }
            }
            if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
              operator_delete((void *)local_1d0._0_8_,CONCAT71(local_1d0._17_7_,local_1d0[0x10]) + 1
                             );
            }
            if ((char)iVar6 == '\0') {
              return true;
            }
          }
LAB_00223156:
          pcVar13 = cmMakefile::FindTargetToUse(this_00->Makefile,name,false);
          if (pcVar13 == (cmTarget *)0x0) {
            cmMakefile::AddImportedTarget
                      (this_00->Makefile,name,targetType,(bool)((byte)local_1d8 & 1));
            return true;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1d0,"cannot create imported target \"",0x1f);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1d0,(name->_M_dataplus)._M_p,name->_M_string_length)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,"\" because another target with the same name already exists.",0x3b);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(this_00,&local_230);
        }
        local_210.field_2._M_allocated_capacity = local_230.field_2._M_allocated_capacity;
        _Var15._M_p = local_230._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != paVar1) goto LAB_002228d9;
        goto LAB_002228e1;
      }
      local_1d0._0_8_ = local_1d0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1d0,"excludeFromAll with IMPORTED target makes no sense.","");
      cmCommand::SetError(this_00,(string *)local_1d0);
LAB_0022292f:
      if ((undefined1 *)local_1d0._0_8_ == local_1d0 + 0x10) {
        return false;
      }
    }
    else {
      bVar4 = cmGeneratorExpression::IsValidTargetName(name_00);
      if (bVar4) {
        if ((local_1dc & 1) == 0) {
          if (((local_1ec & 1) == 0) && ((local_1d8 & 1) == 0)) {
            if ((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start == 0x60) {
              bVar4 = cmMakefile::IsAlias(this_00->Makefile,name_01);
              if (bVar4) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1d0,"cannot create ALIAS target \"",0x1c);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1d0,(name_00->_M_dataplus)._M_p,
                                     name_00->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,"\" because target \"",0x12);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar12,(name_01->_M_dataplus)._M_p,name_01->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,"\" is itself an ALIAS.",0x15);
                std::__cxx11::stringbuf::str();
                cmCommand::SetError(this_00,&local_210);
              }
              else {
                pcVar13 = cmMakefile::FindTargetToUse(this_00->Makefile,name_01,true);
                if (pcVar13 == (cmTarget *)0x0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1d0,"cannot create ALIAS target \"",0x1c);
                  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_1d0,(name_00->_M_dataplus)._M_p,
                                       name_00->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,"\" because target \"",0x12);
                  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar12,(name_01->_M_dataplus)._M_p,name_01->_M_string_length
                                      );
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,"\" does not already exist.",0x19);
                  std::__cxx11::stringbuf::str();
                  cmCommand::SetError(this_00,&local_210);
                }
                else if ((pcVar13->TargetTypeValue - STATIC_LIBRARY < 4) ||
                        (pcVar13->TargetTypeValue == INTERFACE_LIBRARY)) {
                  if ((pcVar13->IsImportedTarget != true) ||
                     (pcVar13->ImportedGloballyVisible != false)) {
                    cmMakefile::AddAlias(this_00->Makefile,name_00,name_01);
                    return true;
                  }
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1d0,"cannot create ALIAS target \"",0x1c);
                  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_1d0,(name_00->_M_dataplus)._M_p,
                                       name_00->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,"\" because target \"",0x12);
                  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar12,(name_01->_M_dataplus)._M_p,name_01->_M_string_length
                                      );
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,"\" is imported but not globally visible.",0x27);
                  std::__cxx11::stringbuf::str();
                  cmCommand::SetError(this_00,&local_210);
                }
                else {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1d0,"cannot create ALIAS target \"",0x1c);
                  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_1d0,(name_00->_M_dataplus)._M_p,
                                       name_00->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,"\" because target \"",0x12);
                  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar12,(name_01->_M_dataplus)._M_p,name_01->_M_string_length
                                      );
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,"\" is not a library.",0x13);
                  std::__cxx11::stringbuf::str();
                  cmCommand::SetError(this_00,&local_210);
                }
              }
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d0,"ALIAS requires exactly one target argument.",0x2b);
              std::__cxx11::stringbuf::str();
              cmCommand::SetError(this_00,&local_210);
            }
            goto LAB_002228c5;
          }
          local_1d0._0_8_ = local_1d0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1d0,"IMPORTED with ALIAS is not allowed.","");
          cmCommand::SetError(this_00,(string *)local_1d0);
        }
        else {
          local_1d0._0_8_ = local_1d0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1d0,"EXCLUDE_FROM_ALL with ALIAS makes no sense.","");
          cmCommand::SetError(this_00,(string *)local_1d0);
        }
        goto LAB_0022292f;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                     "Invalid name for ALIAS: ",name_00);
      cmCommand::SetError(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_1d0);
      if ((undefined1 *)local_1d0._0_8_ == local_1d0 + 0x10) {
        return false;
      }
    }
    operator_delete((void *)local_1d0._0_8_,CONCAT71(local_1d0._17_7_,local_1d0[0x10]) + 1);
  }
  return false;
}

Assistant:

bool cmAddLibraryCommand::InitialPass(std::vector<std::string> const& args,
                                      cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  // Library type defaults to value of BUILD_SHARED_LIBS, if it exists,
  // otherwise it defaults to static library.
  cmStateEnums::TargetType type = cmStateEnums::SHARED_LIBRARY;
  if (cmSystemTools::IsOff(
        this->Makefile->GetDefinition("BUILD_SHARED_LIBS"))) {
    type = cmStateEnums::STATIC_LIBRARY;
  }
  bool excludeFromAll = false;
  bool importTarget = false;
  bool importGlobal = false;

  std::vector<std::string>::const_iterator s = args.begin();

  std::string const& libName = *s;

  ++s;

  // If the second argument is "SHARED" or "STATIC", then it controls
  // the type of library.  Otherwise, it is treated as a source or
  // source list name. There may be two keyword arguments, check for them
  bool haveSpecifiedType = false;
  bool isAlias = false;
  while (s != args.end()) {
    std::string libType = *s;
    if (libType == "STATIC") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting STATIC type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::STATIC_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "SHARED") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting SHARED type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::SHARED_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "MODULE") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting MODULE type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::MODULE_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "OBJECT") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting OBJECT type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::OBJECT_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "UNKNOWN") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting UNKNOWN type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::UNKNOWN_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "ALIAS") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting ALIAS type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      isAlias = true;
    } else if (libType == "INTERFACE") {
      if (haveSpecifiedType) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting/multiple types.";
        this->SetError(e.str());
        return false;
      }
      if (isAlias) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting ALIAS type.";
        this->SetError(e.str());
        return false;
      }
      if (excludeFromAll) {
        std::ostringstream e;
        e << "INTERFACE library may not be used with EXCLUDE_FROM_ALL.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::INTERFACE_LIBRARY;
      haveSpecifiedType = true;
    } else if (*s == "EXCLUDE_FROM_ALL") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library may not be used with EXCLUDE_FROM_ALL.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      excludeFromAll = true;
    } else if (*s == "IMPORTED") {
      ++s;
      importTarget = true;
    } else if (importTarget && *s == "GLOBAL") {
      ++s;
      importGlobal = true;
    } else if (type == cmStateEnums::INTERFACE_LIBRARY && *s == "GLOBAL") {
      std::ostringstream e;
      e << "GLOBAL option may only be used with IMPORTED libraries.";
      this->SetError(e.str());
      return false;
    } else {
      break;
    }
  }

  if (type == cmStateEnums::INTERFACE_LIBRARY) {
    if (s != args.end()) {
      std::ostringstream e;
      e << "INTERFACE library requires no source arguments.";
      this->SetError(e.str());
      return false;
    }
    if (importGlobal && !importTarget) {
      std::ostringstream e;
      e << "INTERFACE library specified as GLOBAL, but not as IMPORTED.";
      this->SetError(e.str());
      return false;
    }
  }

  bool nameOk = cmGeneratorExpression::IsValidTargetName(libName) &&
    !cmGlobalGenerator::IsReservedTarget(libName);

  if (nameOk && !importTarget && !isAlias) {
    nameOk = libName.find(':') == std::string::npos;
  }
  if (!nameOk && !this->Makefile->CheckCMP0037(libName, type)) {
    return false;
  }

  if (isAlias) {
    if (!cmGeneratorExpression::IsValidTargetName(libName)) {
      this->SetError("Invalid name for ALIAS: " + libName);
      return false;
    }
    if (excludeFromAll) {
      this->SetError("EXCLUDE_FROM_ALL with ALIAS makes no sense.");
      return false;
    }
    if (importTarget || importGlobal) {
      this->SetError("IMPORTED with ALIAS is not allowed.");
      return false;
    }
    if (args.size() != 3) {
      std::ostringstream e;
      e << "ALIAS requires exactly one target argument.";
      this->SetError(e.str());
      return false;
    }

    std::string const& aliasedName = *s;
    if (this->Makefile->IsAlias(aliasedName)) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName << "\" because target \""
        << aliasedName << "\" is itself an ALIAS.";
      this->SetError(e.str());
      return false;
    }
    cmTarget* aliasedTarget =
      this->Makefile->FindTargetToUse(aliasedName, true);
    if (!aliasedTarget) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName << "\" because target \""
        << aliasedName
        << "\" does not already "
           "exist.";
      this->SetError(e.str());
      return false;
    }
    cmStateEnums::TargetType aliasedType = aliasedTarget->GetType();
    if (aliasedType != cmStateEnums::SHARED_LIBRARY &&
        aliasedType != cmStateEnums::STATIC_LIBRARY &&
        aliasedType != cmStateEnums::MODULE_LIBRARY &&
        aliasedType != cmStateEnums::OBJECT_LIBRARY &&
        aliasedType != cmStateEnums::INTERFACE_LIBRARY) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName << "\" because target \""
        << aliasedName << "\" is not a library.";
      this->SetError(e.str());
      return false;
    }
    if (aliasedTarget->IsImported() &&
        !aliasedTarget->IsImportedGloballyVisible()) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName << "\" because target \""
        << aliasedName << "\" is imported but not globally visible.";
      this->SetError(e.str());
      return false;
    }
    this->Makefile->AddAlias(libName, aliasedName);
    return true;
  }

  if (importTarget && excludeFromAll) {
    this->SetError("excludeFromAll with IMPORTED target makes no sense.");
    return false;
  }

  /* ideally we should check whether for the linker language of the target
    CMAKE_${LANG}_CREATE_SHARED_LIBRARY is defined and if not default to
    STATIC. But at this point we know only the name of the target, but not
    yet its linker language. */
  if ((type == cmStateEnums::SHARED_LIBRARY ||
       type == cmStateEnums::MODULE_LIBRARY) &&
      !this->Makefile->GetState()->GetGlobalPropertyAsBool(
        "TARGET_SUPPORTS_SHARED_LIBS")) {
    std::ostringstream w;
    w << "ADD_LIBRARY called with "
      << (type == cmStateEnums::SHARED_LIBRARY ? "SHARED" : "MODULE")
      << " option but the target platform does not support dynamic linking. "
         "Building a STATIC library instead. This may lead to problems.";
    this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
    type = cmStateEnums::STATIC_LIBRARY;
  }

  // Handle imported target creation.
  if (importTarget) {
    // The IMPORTED signature requires a type to be specified explicitly.
    if (!haveSpecifiedType) {
      this->SetError("called with IMPORTED argument but no library type.");
      return false;
    }
    if (type == cmStateEnums::OBJECT_LIBRARY) {
      std::string reason;
      if (!this->Makefile->GetGlobalGenerator()->HasKnownObjectFileLocation(
            &reason)) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "The OBJECT library type may not be used for IMPORTED libraries" +
            reason + ".");
        return true;
      }
    }
    if (type == cmStateEnums::INTERFACE_LIBRARY) {
      if (!cmGeneratorExpression::IsValidTargetName(libName)) {
        std::ostringstream e;
        e << "Invalid name for IMPORTED INTERFACE library target: " << libName;
        this->SetError(e.str());
        return false;
      }
    }

    // Make sure the target does not already exist.
    if (this->Makefile->FindTargetToUse(libName)) {
      std::ostringstream e;
      e << "cannot create imported target \"" << libName
        << "\" because another target with the same name already exists.";
      this->SetError(e.str());
      return false;
    }

    // Create the imported target.
    this->Makefile->AddImportedTarget(libName, type, importGlobal);
    return true;
  }

  // A non-imported target may not have UNKNOWN type.
  if (type == cmStateEnums::UNKNOWN_LIBRARY) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      "The UNKNOWN library type may be used only for IMPORTED libraries.");
    return true;
  }

  // Enforce name uniqueness.
  {
    std::string msg;
    if (!this->Makefile->EnforceUniqueName(libName, msg)) {
      this->SetError(msg);
      return false;
    }
  }

  std::vector<std::string> srclists;

  if (type == cmStateEnums::INTERFACE_LIBRARY) {
    if (!cmGeneratorExpression::IsValidTargetName(libName) ||
        libName.find("::") != std::string::npos) {
      std::ostringstream e;
      e << "Invalid name for INTERFACE library target: " << libName;
      this->SetError(e.str());
      return false;
    }

    this->Makefile->AddLibrary(libName, type, srclists, excludeFromAll);
    return true;
  }

  srclists.insert(srclists.end(), s, args.end());

  this->Makefile->AddLibrary(libName, type, srclists, excludeFromAll);

  return true;
}